

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O0

int value_from_text(char *text,value_t *value,char type)

{
  int iVar1;
  char *pcVar2;
  size_t __size;
  uchar *puVar3;
  size_t zlen;
  uint16_t local_28 [2];
  int stmp;
  uint utmp;
  char type_local;
  value_t *value_local;
  char *text_local;
  
  value->type = (int)type;
  stmp._3_1_ = type;
  _utmp = value;
  value_local = (value_t *)text;
  switch(value->type) {
  case 0x43:
    iVar1 = __isoc99_sscanf(text,"#%02hhx%02hhx%02hhx%02hhx",&value->val,
                            (undefined1 *)((long)&value->val + 1),
                            (undefined1 *)((long)&value->val + 2),
                            (undefined1 *)((long)&value->val + 3));
    if (iVar1 != 4) {
      fprintf(_stderr,"%s:value_from_text: couldn\'t parse \'%c\' from  \"%s\"\n",argv0,
              (ulong)(uint)_utmp->type,value_local);
      return 0;
    }
    break;
  default:
    fprintf(_stderr,"%s:value_from_text: invalid type \'%c\'\n",argv0,(ulong)(uint)value->type);
    return 0;
  case 0x53:
    iVar1 = __isoc99_sscanf(text,"%d",&value->val);
    if (iVar1 != 1) {
      fprintf(_stderr,"%s:value_from_text: couldn\'t parse \'%c\' from  \"%s\"\n",argv0,
              (ulong)(uint)_utmp->type,value_local);
      return 0;
    }
    break;
  case 0x55:
    iVar1 = __isoc99_sscanf(text,"%u",&value->val);
    if (iVar1 != 1) {
      fprintf(_stderr,"%s:value_from_text: couldn\'t parse \'%c\' from  \"%s\"\n",argv0,
              (ulong)(uint)_utmp->type,value_local);
      return 0;
    }
    break;
  case 0x62:
    iVar1 = __isoc99_sscanf(text,"%u",local_28);
    if (iVar1 != 1) {
      fprintf(_stderr,"%s:value_from_text: couldn\'t parse \'%c\' from  \"%s\"\n",argv0,
              (ulong)(uint)_utmp->type,value_local);
      return 0;
    }
    (_utmp->val).b = (uchar)local_28[0];
    break;
  case 99:
    iVar1 = __isoc99_sscanf(text,"%d",(long)&zlen + 4);
    if (iVar1 != 1) {
      fprintf(_stderr,"%s:value_from_text: couldn\'t parse \'%c\' from  \"%s\"\n",argv0,
              (ulong)(uint)_utmp->type,value_local);
      return 0;
    }
    (_utmp->val).b = (uchar)zlen._4_4_;
    break;
  case 100:
    iVar1 = __isoc99_sscanf(text,"%lf",&value->val);
    if (iVar1 != 1) {
      fprintf(_stderr,"%s:value_from_text: couldn\'t parse \'%c\' from  \"%s\"\n",argv0,
              (ulong)(uint)_utmp->type,value_local);
      return 0;
    }
    break;
  case 0x66:
    iVar1 = __isoc99_sscanf(text,"%f",&value->val);
    if (iVar1 != 1) {
      fprintf(_stderr,"%s:value_from_text: couldn\'t parse \'%c\' from  \"%s\"\n",argv0,
              (ulong)(uint)_utmp->type,value_local);
      return 0;
    }
    break;
  case 0x6d:
    __size = strlen(text);
    puVar3 = (uchar *)malloc(__size);
    (_utmp->val).m.data = puVar3;
    memcpy((_utmp->val).m.data,value_local,__size);
    (_utmp->val).m.length = __size;
    break;
  case 0x73:
    iVar1 = __isoc99_sscanf(text,"%d",(long)&zlen + 4);
    if (iVar1 != 1) {
      fprintf(_stderr,"%s:value_from_text: couldn\'t parse \'%c\' from  \"%s\"\n",argv0,
              (ulong)(uint)_utmp->type,value_local);
      return 0;
    }
    (_utmp->val).u = zlen._4_2_;
    break;
  case 0x75:
    iVar1 = __isoc99_sscanf(text,"%u",local_28);
    if (iVar1 != 1) {
      fprintf(_stderr,"%s:value_from_text: couldn\'t parse \'%c\' from  \"%s\"\n",argv0,
              (ulong)(uint)_utmp->type,value_local);
      return 0;
    }
    (_utmp->val).u = local_28[0];
    break;
  case 0x7a:
    pcVar2 = strdup(text);
    (_utmp->val).z = pcVar2;
  }
  return 1;
}

Assistant:

int
value_from_text(
    const char* text,
    value_t* value,
    char type)
{
#define READ(f, x) \
    if (sscanf(text, "%" #f, &x) != 1) { \
        fprintf(stderr, "%s:value_from_text: couldn't parse '%c' from  \"%s\"\n", argv0, value->type, text); \
        return 0; \
    }

    unsigned int utmp;
    int stmp;

    value->type = type;

    switch (value->type) {
    case 'f':
        READ(f, value->val.f);
        break;
    case 'd':
        READ(lf, value->val.d);
        break;
    case 'b':
        READ(u, utmp);
        value->val.b = utmp;
        break;
    case 'c':
        READ(d, stmp);
        value->val.c = stmp;
        break;
    case 'u':
        READ(u, utmp);
        value->val.u = utmp;
        break;
    case 's':
        READ(d, stmp);
        value->val.s = stmp;
        break;
    case 'U':
        READ(u, value->val.U);
        break;
    case 'S':
        READ(d, value->val.S);
        break;
    case 'C':
        if (sscanf(text, "#%02hhx%02hhx%02hhx%02hhx", &value->val.C[0], &value->val.C[1], &value->val.C[2], &value->val.C[3]) != 4) {
            fprintf(stderr, "%s:value_from_text: couldn't parse '%c' from  \"%s\"\n", argv0, value->type, text);
            return 0;
        }
        break;
    case 'z':
        value->val.z = strdup(text);
        break;
    case 'm': {
        size_t zlen = strlen(text);
        value->val.m.data = malloc(zlen);
        memcpy(value->val.m.data, text, zlen);
        value->val.m.length = zlen;
        break;
    }
    default:
        fprintf(stderr, "%s:value_from_text: invalid type '%c'\n", argv0, value->type);
        return 0;
    }

    return 1;

#undef READ
}